

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QtGraphicsAnchorLayout::AnchorData_*>
QSet<QtGraphicsAnchorLayout::AnchorData_*>::intersected_helper
          (QSet<QtGraphicsAnchorLayout::AnchorData_*> *lhs,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs)

{
  bool bVar1;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *this;
  AnchorData **in_RDX;
  Hash in_RDI;
  long in_FS_OFFSET;
  AnchorData **e_1;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *__range2_1;
  AnchorData **e;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *__range2;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *r;
  const_iterator it;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  const_iterator __end0;
  const_iterator __begin0;
  qsizetype r_size;
  qsizetype l_size;
  Data *this_00;
  AnchorData **in_stack_ffffffffffffff30;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *in_stack_ffffffffffffff38;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI.d;
  QSet((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b86b);
  local_10 = size((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b875);
  local_18 = size((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b887);
  std::min<long_long>(&local_10,&local_18);
  reserve((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)this_00,(qsizetype)in_RDI.d);
  if (local_18 < local_10) {
    begin(in_stack_ffffffffffffff38);
    end(in_stack_ffffffffffffff38);
    while (bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d),
          bVar1) {
      const_iterator::operator*((const_iterator *)0x94ba71);
      find(in_stack_ffffffffffffff38,in_RDX);
      end(in_stack_ffffffffffffff38);
      bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d);
      if (bVar1) {
        const_iterator::operator*((const_iterator *)0x94bad0);
        insert(in_stack_ffffffffffffff38,in_RDX);
      }
      const_iterator::operator++((const_iterator *)this_00);
    }
  }
  else {
    begin(in_stack_ffffffffffffff38);
    end(in_stack_ffffffffffffff38);
    while (bVar1 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI.d),
          bVar1) {
      this = (QSet<QtGraphicsAnchorLayout::AnchorData_*> *)
             const_iterator::operator*((const_iterator *)0x94b977);
      bVar1 = contains((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)this_00,(AnchorData **)in_RDI.d
                      );
      if (bVar1) {
        insert(this,in_stack_ffffffffffffff30);
      }
      const_iterator::operator++((const_iterator *)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSet<QtGraphicsAnchorLayout::AnchorData_*>)(Hash)in_RDI.d;
  }
  __stack_chk_fail();
}

Assistant:

auto QSet<T>::intersected_helper(const QSet &lhs, const QSet &rhs) -> QSet
{
    QSet r;

    const auto l_size = lhs.size();
    const auto r_size = rhs.size();
    r.reserve((std::min)(l_size, r_size));

    // Iterate the smaller of the two sets, but always take from lhs, for
    // consistency with insert():

    if (l_size <= r_size) {
        // lhs is not larger
        for (const auto &e : lhs) {
            if (rhs.contains(e))
                r.insert(e);
        }
    } else {
        // rhs is smaller
        for (const auto &e : rhs) {
            if (const auto it = lhs.find(e); it != lhs.end())
                r.insert(*it);
        }
    }

    return r;
}